

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O3

void __thiscall InputError::InputError(InputError *this,int type,string *token)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = 8;
  if ((uint)type < 8) {
    iVar1 = type;
  }
  (this->super_ENerror).msg._M_dataplus._M_p = (pointer)&(this->super_ENerror).msg.field_2;
  (this->super_ENerror).msg._M_string_length = 0;
  (this->super_ENerror).msg.field_2._M_local_buf[0] = '\0';
  (this->super_ENerror)._vptr_ENerror = (_func_int **)&PTR__ENerror_00156ae0;
  (this->super_ENerror).code = *(int *)((long)InputErrorCodes + (ulong)(uint)(iVar1 << 2));
  std::operator+(&local_40,
                 _ZL14InputErrorMsgs_rel + *(int *)(_ZL14InputErrorMsgs_rel + (uint)(iVar1 << 2)),
                 token);
  std::__cxx11::string::operator=((string *)&(this->super_ENerror).msg,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

InputError::InputError(int type, string token)
{
    if (type < 0 || type >= UNSPECIFIED) type = UNSPECIFIED;
    code = InputErrorCodes[type];
    msg = InputErrorMsgs[type] + token;
}